

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

void __thiscall Potassco::ProgramOptions::OptionGroup::~OptionGroup(OptionGroup *this)

{
  pointer pcVar1;
  
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::~vector(&this->options_);
  pcVar1 = (this->caption_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->caption_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

OptionGroup::~OptionGroup() {}